

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall olc::Sprite::Sprite(Sprite *this,int32_t w,int32_t h)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  Pixel *pPVar4;
  Pixel *local_60;
  anon_union_4_2_12391da5_for_Pixel_0 local_2c;
  int local_28;
  int32_t i;
  int32_t local_18;
  int32_t local_14;
  int32_t h_local;
  int32_t w_local;
  Sprite *this_local;
  
  this->width = 0;
  this->height = 0;
  this->pColData = (Pixel *)0x0;
  this->modeSample = NORMAL;
  local_18 = h;
  local_14 = w;
  _h_local = this;
  if ((this->pColData != (Pixel *)0x0) && (this->pColData != (Pixel *)0x0)) {
    operator_delete__(this->pColData);
  }
  this->width = local_14;
  this->height = local_18;
  uVar2 = (ulong)(this->width * this->height);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pPVar4 = (Pixel *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_60 = pPVar4;
    do {
      Pixel::Pixel(local_60);
      local_60 = local_60 + 1;
    } while (local_60 != pPVar4 + uVar2);
  }
  this->pColData = pPVar4;
  for (local_28 = 0; local_28 < this->width * this->height; local_28 = local_28 + 1) {
    Pixel::Pixel((Pixel *)&local_2c.field_1);
    this->pColData[local_28].field_0 = local_2c;
  }
  return;
}

Assistant:

Sprite::Sprite(int32_t w, int32_t h)
	{
		if (pColData) delete[] pColData;
		width = w;		height = h;
		pColData = new Pixel[width * height];
		for (int32_t i = 0; i < width * height; i++)
			pColData[i] = Pixel();
	}